

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ActivationSoftplus::~ActivationSoftplus(ActivationSoftplus *this)

{
  ActivationSoftplus *this_local;
  
  ~ActivationSoftplus(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

ActivationSoftplus::~ActivationSoftplus() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.ActivationSoftplus)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}